

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageInputTest.cpp
# Opt level: O0

void __thiscall imageInput_invalidFile_Test::TestBody(imageInput_invalidFile_Test *this)

{
  byte bVar1;
  ReaderWriterMock *this_00;
  MockSpec<cv::Mat_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *pMVar2;
  TypedExpectation<cv::Mat_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *pTVar3;
  ostream *poVar4;
  void *this_01;
  IReaderWriter *local_710;
  AssertionResult gtest_ar;
  exception *err;
  AssertHelper local_6a0;
  Message local_698;
  string local_690 [32];
  undefined1 local_670 [8];
  Mat result;
  int local_664;
  Mat local_610 [96];
  ReturnAction<cv::Mat> local_5b0;
  Action<cv::Mat_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  local_5a0;
  Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_590;
  Mat local_578 [8];
  Mat m;
  Mat local_518 [96];
  ReturnAction<cv::Mat> local_4b8;
  Action<cv::Mat_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  local_4a8;
  Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_498;
  MatExpr local_480 [352];
  MatExpr local_320 [8];
  Mat z;
  undefined1 local_2c0 [8];
  ifstream infile;
  allocator local_b1;
  string local_b0 [8];
  string fileName;
  ReaderWriterMock *readerMock;
  ImageInput imageInput;
  imageInput_invalidFile_Test *this_local;
  
  imageInput.reader = (IReaderWriter *)this;
  ImageInput::ImageInput((ImageInput *)&readerMock);
  this_00 = (ReaderWriterMock *)operator_new(0x158);
  memset(this_00,0,0x158);
  ReaderWriterMock::ReaderWriterMock(this_00);
  local_710 = (IReaderWriter *)0x0;
  if (this_00 != (ReaderWriterMock *)0x0) {
    local_710 = (IReaderWriter *)(&this_00->field_0x0 + *(long *)(*(long *)this_00 + -0x30));
  }
  ImageInput::setReader((ImageInput *)&readerMock,local_710);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"../test/23_Human.jpg",&local_b1);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  std::ifstream::ifstream(local_2c0,local_b0,8);
  bVar1 = std::ios::good();
  if ((bVar1 & 1) == 0) {
    cv::Mat::Mat(local_578);
    testing::internal::AnythingMatcher::operator_cast_to_Matcher
              (&local_590,(AnythingMatcher *)&testing::_);
    pMVar2 = ReaderWriterMock::gmock_read(this_00,&local_590);
    pTVar3 = testing::internal::
             MockSpec<cv::Mat_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
             ::InternalExpectedAt
                       (pMVar2,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/urastogi885[P]humanDetectionModule/test/ImageInputTest.cpp"
                        ,0x40,"*readerMock","read(_)");
    cv::Mat::Mat(local_610,local_578);
    testing::Return<cv::Mat>((testing *)&local_5b0,local_610);
    testing::internal::ReturnAction::operator_cast_to_Action((ReturnAction *)&local_5a0);
    testing::internal::
    TypedExpectation<cv::Mat_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
    ::WillRepeatedly(pTVar3,&local_5a0);
    testing::
    Action<cv::Mat_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
    ::~Action(&local_5a0);
    testing::internal::ReturnAction<cv::Mat>::~ReturnAction(&local_5b0);
    cv::Mat::~Mat(local_610);
    testing::
    Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~Matcher(&local_590);
    cv::Mat::~Mat(local_578);
  }
  else {
    cv::Mat::zeros((int)local_480,0x2d0,0x500);
    cv::MatExpr::operator_cast_to_Mat(local_320);
    cv::MatExpr::~MatExpr(local_480);
    testing::internal::AnythingMatcher::operator_cast_to_Matcher
              (&local_498,(AnythingMatcher *)&testing::_);
    pMVar2 = ReaderWriterMock::gmock_read(this_00,&local_498);
    pTVar3 = testing::internal::
             MockSpec<cv::Mat_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
             ::InternalExpectedAt
                       (pMVar2,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/urastogi885[P]humanDetectionModule/test/ImageInputTest.cpp"
                        ,0x3b,"*readerMock","read(_)");
    cv::Mat::Mat(local_518,(Mat *)local_320);
    testing::Return<cv::Mat>((testing *)&local_4b8,local_518);
    testing::internal::ReturnAction::operator_cast_to_Action((ReturnAction *)&local_4a8);
    testing::internal::
    TypedExpectation<cv::Mat_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
    ::WillRepeatedly(pTVar3,&local_4a8);
    testing::
    Action<cv::Mat_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
    ::~Action(&local_4a8);
    testing::internal::ReturnAction<cv::Mat>::~ReturnAction(&local_4b8);
    cv::Mat::~Mat(local_518);
    testing::
    Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~Matcher(&local_498);
    cv::Mat::~Mat((Mat *)local_320);
  }
  std::__cxx11::string::string(local_690,local_b0);
  ImageInput::readImage((ImageInput *)local_670,(string *)&readerMock);
  std::__cxx11::string::~string(local_690);
  poVar4 = (ostream *)std::ostream::operator<<(&std::cout,_result);
  poVar4 = std::operator<<(poVar4," ");
  this_01 = (void *)std::ostream::operator<<(poVar4,local_664);
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  testing::Message::Message(&local_698);
  testing::internal::AssertHelper::AssertHelper
            (&local_6a0,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/urastogi885[P]humanDetectionModule/test/ImageInputTest.cpp"
             ,0x48,"Failed");
  testing::internal::AssertHelper::operator=(&local_6a0,&local_698);
  testing::internal::AssertHelper::~AssertHelper(&local_6a0);
  testing::Message::~Message(&local_698);
  cv::Mat::~Mat((Mat *)local_670);
  std::ifstream::~ifstream(local_2c0);
  std::__cxx11::string::~string(local_b0);
  ImageInput::~ImageInput((ImageInput *)&readerMock);
  return;
}

Assistant:

TEST(imageInput, invalidFile) {
  /// Instantiate objects for various classes
  ImageInput imageInput;
  ReaderWriterMock* readerMock = new ReaderWriterMock();
  /// Set mock to read images
  imageInput.setReader(readerMock);
  /// Declare file path
  const std::string fileName = "../test/23_Human.jpg";
  /// Add mock implementation to check validity of image file path
  std::ifstream infile(fileName);
  if (infile.good()) {
    /// If file path exist then return full mat file
    cv::Mat z = cv::Mat::zeros(720, 1280, CV_8U);
    EXPECT_CALL(*readerMock, read(_)).WillRepeatedly(
      Return(z));
  } else {
      /// If file path does not exist then return empty mat file
    cv::Mat m;
    EXPECT_CALL(*readerMock, read(_)).WillRepeatedly(
      Return(m));
  }

  try {
    /// try to read image
    cv::Mat result = imageInput.readImage(fileName);
    std::cout << result.rows << " " << result.cols << std::endl;
    FAIL();  // Expected std::invalid file path exception
  }
  catch(std::exception& err) {
    EXPECT_EQ(err.what(), std::string("Invalid File Path"));
  }
  /// delete mock object
  delete readerMock;
}